

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# posix_watcher.hpp
# Opt level: O0

void __thiscall vfs::posix_watcher::run(posix_watcher *this,bool folders,bool files)

{
  int __fd;
  FILE *__stream;
  bool bVar1;
  uchar *__buf;
  int *piVar2;
  char *pcVar3;
  reference pvVar4;
  inotify_event *pEvent;
  string local_120;
  ssize_t local_100;
  ssize_t sizeReadInBytes;
  int eventBufferOffset;
  allocator<unsigned_char> local_e1;
  undefined1 local_e0 [8];
  vector<unsigned_char,_std::allocator<unsigned_char>_> eventBuffer;
  unsigned_long bufferLength;
  unsigned_long eventSize;
  _union_1457 _Stack_b0;
  int maxNumEventsToRead;
  sigaction sa;
  bool files_local;
  bool folders_local;
  posix_watcher *this_local;
  
  _Stack_b0.sa_handler = (__sighandler_t)0x0;
  sa.sa_restorer._6_1_ = files;
  sa.sa_restorer._7_1_ = folders;
  sigemptyset((sigset_t *)&sa);
  sigaction(10,(sigaction *)&stack0xffffffffffffff50,(sigaction *)0x0);
  std::function<void_(const_vfs::path_&)>::operator()(&this->callback_,&this->dir_);
  eventBuffer.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x1000;
  std::allocator<unsigned_char>::allocator(&local_e1);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_e0,0x1000,&local_e1);
  std::allocator<unsigned_char>::~allocator(&local_e1);
  do {
    bVar1 = std::atomic::operator_cast_to_bool((atomic *)this);
    if (!bVar1) {
LAB_0014e5d9:
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
                ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_e0);
      return;
    }
    sizeReadInBytes._0_4_ = 0;
    __fd = this->inotifyFd_;
    __buf = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data
                      ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_e0);
    local_100 = read(__fd,__buf,0x1000);
    __stream = _stderr;
    if (local_100 == -1) {
      piVar2 = __errno_location();
      get_last_error_as_string_abi_cxx11_(&local_120,*piVar2);
      pcVar3 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
               c_str(&local_120);
      fprintf(__stream,"[ error    ] read() of inotify file descriptor failed with error: %s\n",
              pcVar3);
      std::__cxx11::string::~string((string *)&local_120);
      goto LAB_0014e5d9;
    }
    for (; (int)sizeReadInBytes < local_100;
        sizeReadInBytes._0_4_ = (int)sizeReadInBytes + *(int *)(pvVar4 + 0xc) + 0x10) {
      pvVar4 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                         ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_e0,
                          (long)(int)sizeReadInBytes);
      if ((*(uint *)(pvVar4 + 4) & 0x8000) == 0) {
        if ((*(uint *)(pvVar4 + 4) & 0x40000000) == 0) {
          if ((*(int *)(pvVar4 + 0xc) != 0) && ((sa.sa_restorer._6_1_ & 1) != 0)) {
            std::function<void_(const_vfs::path_&)>::operator()(&this->callback_,&this->dir_);
          }
        }
        else if ((sa.sa_restorer._7_1_ & 1) != 0) {
          std::function<void_(const_vfs::path_&)>::operator()(&this->callback_,&this->dir_);
        }
      }
      else {
        bVar1 = std::atomic::operator_cast_to_bool((atomic *)this);
        if (!bVar1) goto LAB_0014e5d9;
      }
    }
  } while( true );
}

Assistant:

void run(bool folders, bool files)
        {
            // This is set up to end the thread if killed by SIGUSR1.
            struct sigaction sa;
            sa.sa_handler   = nullptr;
            sa.sa_sigaction = nullptr;
            sigemptyset(&sa.sa_mask);
            sigaction(SIGUSR1, &sa, nullptr);

            // Call the callback in case we have some folders in there waiting before we started the process
            callback_(dir_);

            constexpr auto maxNumEventsToRead   = 128;
            constexpr auto eventSize            = sizeof(struct inotify_event);
            constexpr auto bufferLength         = maxNumEventsToRead*(eventSize+16);
            auto eventBuffer                    = std::vector<uint8_t>(bufferLength);

            while (running_)
            {
                // Multiple events can be read at a time.
                auto eventBufferOffset = 0;

                // Will block until a new event takes place.
                const auto sizeReadInBytes = read(inotifyFd_, eventBuffer.data(), bufferLength);
                if(sizeReadInBytes == -1)
                {
                    vfs_errorf("read() of inotify file descriptor failed with error: %s",
                               get_last_error_as_string(errno).c_str());
                    return;
                }

                while (eventBufferOffset < sizeReadInBytes)
                {
                    const auto pEvent = reinterpret_cast<struct inotify_event *>(&eventBuffer[eventBufferOffset]);

                    if ((pEvent->mask & IN_IGNORED) != 0)
                    {
                        // IN_IGNORED is set when the caller thread removes watch.
                        // This can also happen when the watched file/directory was deleted
                        // or the filesystem was unmounted.
                        if(running_ == false)
                        {
                            return;
                        }
                    }
                    else if((pEvent->mask & IN_ISDIR) != 0)
                    {
                        if (folders)
                        {
                            // A directory has been created/deleted.
                            callback_(dir_);
                        }
                    }
                    else if (pEvent->len != 0)
                    {
                        if (files)
                        {
                            // A file has been created/deleted.
                            callback_(dir_);
                        }
                    }

                    eventBufferOffset += eventSize + pEvent->len;
                }
            }
        }